

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O3

void __thiscall Gillespie::LinkReaction(Gillespie *this,Ptr *reaction)

{
  element_type *peVar1;
  iterator __position;
  __normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
  _Var2;
  double extraout_XMM0_Qa;
  double new_prop;
  double local_28;
  
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Reaction>*,std::vector<std::shared_ptr<Reaction>,std::allocator<std::shared_ptr<Reaction>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<Reaction>const>>
                    ((this->reactions_).
                     super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->reactions_).
                     super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,reaction);
  if (_Var2._M_current ==
      (this->reactions_).
      super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    peVar1 = (reaction->super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar1->_vptr_Reaction[3])
              (peVar1,(ulong)((long)_Var2._M_current -
                             (long)(this->reactions_).
                                   super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff);
    (**((reaction->super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Reaction
    )();
    __position._M_current =
         (this->alpha_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_28 = extraout_XMM0_Qa;
    if (__position._M_current ==
        (this->alpha_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->alpha_list_,__position,&local_28);
    }
    else {
      *__position._M_current = extraout_XMM0_Qa;
      (this->alpha_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    this->alpha_sum_ = local_28 + this->alpha_sum_;
    std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::push_back
              (&this->reactions_,reaction);
  }
  return;
}

Assistant:

void Gillespie::LinkReaction(Reaction::Ptr reaction) {
  auto it = std::find(reactions_.begin(), reactions_.end(), reaction);
  if (it == reactions_.end()) {
    reaction->index(reactions_.size());
    double new_prop = reaction->CalculatePropensity();
    alpha_list_.push_back(new_prop);
    alpha_sum_ += new_prop;
    reactions_.push_back(reaction);
  }
}